

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fNegativeTextureApiTests.cpp
# Opt level: O3

void deqp::gles31::Functional::NegativeTestShared::pixelstorei(NegativeTestContext *ctx)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  string local_30;
  
  paVar1 = &local_30.field_2;
  local_30._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_30,"GL_INVALID_ENUM is generated if pname is not an accepted value.",
             "");
  NegativeTestContext::beginSection(ctx,&local_30);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != paVar1) {
    operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
  }
  glu::CallLogWrapper::glPixelStorei(&ctx->super_CallLogWrapper,0,1);
  NegativeTestContext::expectError(ctx,0x500);
  NegativeTestContext::endSection(ctx);
  local_30._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_30,
             "GL_INVALID_VALUE is generated if a negative row length, pixel skip, or row skip value is specified, or if alignment is specified as other than 1, 2, 4, or 8."
             ,"");
  NegativeTestContext::beginSection(ctx,&local_30);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != paVar1) {
    operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
  }
  glu::CallLogWrapper::glPixelStorei(&ctx->super_CallLogWrapper,0xd02,-1);
  NegativeTestContext::expectError(ctx,0x501);
  glu::CallLogWrapper::glPixelStorei(&ctx->super_CallLogWrapper,0xd03,-1);
  NegativeTestContext::expectError(ctx,0x501);
  glu::CallLogWrapper::glPixelStorei(&ctx->super_CallLogWrapper,0xd04,-1);
  NegativeTestContext::expectError(ctx,0x501);
  glu::CallLogWrapper::glPixelStorei(&ctx->super_CallLogWrapper,0xcf2,-1);
  NegativeTestContext::expectError(ctx,0x501);
  glu::CallLogWrapper::glPixelStorei(&ctx->super_CallLogWrapper,0x806e,-1);
  NegativeTestContext::expectError(ctx,0x501);
  glu::CallLogWrapper::glPixelStorei(&ctx->super_CallLogWrapper,0xcf3,-1);
  NegativeTestContext::expectError(ctx,0x501);
  glu::CallLogWrapper::glPixelStorei(&ctx->super_CallLogWrapper,0xcf4,-1);
  NegativeTestContext::expectError(ctx,0x501);
  glu::CallLogWrapper::glPixelStorei(&ctx->super_CallLogWrapper,0x806d,-1);
  NegativeTestContext::expectError(ctx,0x501);
  glu::CallLogWrapper::glPixelStorei(&ctx->super_CallLogWrapper,0xd05,0);
  NegativeTestContext::expectError(ctx,0x501);
  glu::CallLogWrapper::glPixelStorei(&ctx->super_CallLogWrapper,0xcf5,0);
  NegativeTestContext::expectError(ctx,0x501);
  glu::CallLogWrapper::glPixelStorei(&ctx->super_CallLogWrapper,0xd05,0x10);
  NegativeTestContext::expectError(ctx,0x501);
  glu::CallLogWrapper::glPixelStorei(&ctx->super_CallLogWrapper,0xcf5,0x10);
  NegativeTestContext::expectError(ctx,0x501);
  NegativeTestContext::endSection(ctx);
  return;
}

Assistant:

void pixelstorei (NegativeTestContext& ctx)
{
	ctx.beginSection("GL_INVALID_ENUM is generated if pname is not an accepted value.");
	ctx.glPixelStorei(0,1);
	ctx.expectError(GL_INVALID_ENUM);
	ctx.endSection();

	ctx.beginSection("GL_INVALID_VALUE is generated if a negative row length, pixel skip, or row skip value is specified, or if alignment is specified as other than 1, 2, 4, or 8.");
	ctx.glPixelStorei(GL_PACK_ROW_LENGTH, -1);
	ctx.expectError(GL_INVALID_VALUE);
	ctx.glPixelStorei(GL_PACK_SKIP_ROWS, -1);
	ctx.expectError(GL_INVALID_VALUE);
	ctx.glPixelStorei(GL_PACK_SKIP_PIXELS, -1);
	ctx.expectError(GL_INVALID_VALUE);
	ctx.glPixelStorei(GL_UNPACK_ROW_LENGTH, -1);
	ctx.expectError(GL_INVALID_VALUE);
	ctx.glPixelStorei(GL_UNPACK_IMAGE_HEIGHT, -1);
	ctx.expectError(GL_INVALID_VALUE);
	ctx.glPixelStorei(GL_UNPACK_SKIP_ROWS, -1);
	ctx.expectError(GL_INVALID_VALUE);
	ctx.glPixelStorei(GL_UNPACK_SKIP_PIXELS, -1);
	ctx.expectError(GL_INVALID_VALUE);
	ctx.glPixelStorei(GL_UNPACK_SKIP_IMAGES, -1);
	ctx.expectError(GL_INVALID_VALUE);
	ctx.glPixelStorei(GL_PACK_ALIGNMENT, 0);
	ctx.expectError(GL_INVALID_VALUE);
	ctx.glPixelStorei(GL_UNPACK_ALIGNMENT, 0);
	ctx.expectError(GL_INVALID_VALUE);
	ctx.glPixelStorei(GL_PACK_ALIGNMENT, 16);
	ctx.expectError(GL_INVALID_VALUE);
	ctx.glPixelStorei(GL_UNPACK_ALIGNMENT, 16);
	ctx.expectError(GL_INVALID_VALUE);
	ctx.endSection();
}